

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcptran_dial_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  tcptran_pipe *in_RAX;
  nng_stream *conn;
  tcptran_pipe *local_28;
  tcptran_pipe *p;
  
  local_28 = in_RAX;
  nni_mtx_lock((nni_mtx *)arg);
  result = nni_aio_result((nni_aio *)((long)arg + 0x50));
  if (result == NNG_OK) {
    conn = (nng_stream *)nni_aio_get_output((nni_aio *)((long)arg + 0x50),0);
    result = NNG_ECLOSED;
    if (*(char *)((long)arg + 0x3a) == '\0') {
      result = nni_pipe_alloc_dialer(&local_28,*(nni_dialer **)((long)arg + 0x428));
      if (result == NNG_OK) {
        tcptran_pipe_start(local_28,conn,(tcptran_ep *)arg);
        goto LAB_00124aa6;
      }
    }
    nng_stream_free(conn);
  }
  aio = *(nni_aio **)((long)arg + 0x48);
  if (aio != (nni_aio *)0x0) {
    *(undefined8 *)((long)arg + 0x48) = 0;
    nni_aio_finish_error(aio,result);
  }
LAB_00124aa6:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
tcptran_dial_cb(void *arg)
{
	tcptran_ep   *ep  = arg;
	nni_aio      *aio = &ep->connaio;
	tcptran_pipe *p;
	int           rv;
	nng_stream   *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nng_stream_free(conn);
		goto error;
	}
	tcptran_pipe_start(p, conn, ep);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// Error connecting.  We need to pass this straight back
	// to the user.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}